

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O0

void __thiscall
cmCPackIFWResourcesParser::~cmCPackIFWResourcesParser(cmCPackIFWResourcesParser *this)

{
  cmCPackIFWResourcesParser *this_local;
  
  ~cmCPackIFWResourcesParser(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

cmCPackIFWResourcesParser(cmCPackIFWInstaller* i)
    : installer(i)
    , file(false)
  {
    this->path = i->Directory + "/resources";
  }